

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::dataTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,ArrayFeatureType_ArrayDataType dataType)

{
  code *pcVar1;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  ArrayFeatureType_ArrayDataType dataType_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 != 0) {
    if (local_14 == 0x10020) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Float32",&local_26);
      std::allocator<char>::~allocator((allocator<char> *)&local_26);
      return __return_storage_ptr__;
    }
    if (local_14 == 0x10040) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Double",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      return __return_storage_ptr__;
    }
    if (local_14 == 0x20020) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Int32",&local_15);
      std::allocator<char>::~allocator((allocator<char> *)&local_15);
      return __return_storage_ptr__;
    }
    if (local_14 != 0x7fffffff) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Invalid",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  return __return_storage_ptr__;
}

Assistant:

static std::string dataTypeToString(Specification::ArrayFeatureType_ArrayDataType dataType) {
        switch (dataType) {
            case Specification::ArrayFeatureType_ArrayDataType_INT32:
                return "Int32";
            case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                return "Double";
            case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                return "Float32";
            case Specification::ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MAX_SENTINEL_DO_NOT_USE_:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MIN_SENTINEL_DO_NOT_USE_:
                return "Invalid";
        }
    }